

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BestLiteralSelector.hpp
# Opt level: O3

void __thiscall
Kernel::
CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
::doSelection(CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
              *this,Clause *c,uint eligible)

{
  List<Kernel::Literal_*> **ppLVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Cell *pCVar5;
  CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
  *pCVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  size_t i;
  TermList TVar10;
  TermList TVar11;
  Literal **ppLVar12;
  size_t i_2;
  ulong uVar13;
  List<Kernel::Literal_*> *pLVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  undefined4 uVar18;
  Literal **res;
  Literal *pLVar19;
  LiteralList *pLVar20;
  Clause *this_00;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar24;
  undefined1 auVar23 [16];
  LiteralList *maximals;
  bool dummy_2;
  bool dummy;
  Set<Kernel::Literal_*,_Lib::DefaultHash> maxSet;
  LiteralList *local_a8;
  uint local_a0;
  bool local_99;
  Clause *local_98;
  Literal *local_90;
  CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
  *local_88;
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>
  local_80;
  
  if (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
      ::doSelection(Kernel::Clause*,unsigned_int)::combSup == '\0') {
    CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
    ::doSelection();
  }
  local_98 = c;
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::litArr == '\0') &&
     (iVar9 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::litArr), iVar9 != 0)
     ) {
    doSelection::litArr._size = 0x40;
    doSelection::litArr._capacity = 0x40;
    ppLVar12 = (Literal **)::operator_new(0x200,0x10);
    if (doSelection::litArr._capacity != 0) {
      memset(ppLVar12,0,doSelection::litArr._capacity << 3);
    }
    doSelection::litArr._array = ppLVar12;
    __cxa_atexit(Lib::DArray<Kernel::Literal_*>::~DArray,&doSelection::litArr,&__dso_handle);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::litArr);
    c = local_98;
  }
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads == '\0') &&
     (iVar9 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads),
     iVar9 != 0)) {
    doSelection::maxTermHeads._capacity = 0;
    doSelection::maxTermHeads._nonemptyCells = 0;
    doSelection::maxTermHeads._size = 0;
    doSelection::maxTermHeads._entries = (Cell *)0x0;
    Lib::Set<unsigned_int,_Lib::DefaultHash>::expand(&doSelection::maxTermHeads);
    __cxa_atexit(Lib::Set<unsigned_int,_Lib::DefaultHash>::~Set,&doSelection::maxTermHeads,
                 &__dso_handle);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads);
    c = local_98;
  }
  pCVar5 = doSelection::maxTermHeads._entries;
  auVar4 = _DAT_0084f040;
  auVar3 = _DAT_0084f030;
  auVar2 = _DAT_0084f020;
  if (doSelection::maxTermHeads._entries != doSelection::maxTermHeads._afterLast) {
    uVar13 = (long)doSelection::maxTermHeads._afterLast +
             (-8 - (long)doSelection::maxTermHeads._entries);
    auVar23._8_4_ = (int)uVar13;
    auVar23._0_8_ = uVar13;
    auVar23._12_4_ = (int)(uVar13 >> 0x20);
    auVar21._0_8_ = uVar13 >> 3;
    auVar21._8_8_ = auVar23._8_8_ >> 3;
    uVar16 = 0;
    auVar21 = auVar21 ^ _DAT_0084f040;
    do {
      auVar22._8_4_ = (int)uVar16;
      auVar22._0_8_ = uVar16;
      auVar22._12_4_ = (int)(uVar16 >> 0x20);
      auVar23 = (auVar22 | auVar3) ^ auVar4;
      iVar9 = auVar21._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar9 && auVar21._0_4_ < auVar23._0_4_ || iVar9 < auVar23._4_4_)
                & 1)) {
        pCVar5[uVar16].code = 0;
      }
      if ((auVar23._12_4_ != auVar21._12_4_ || auVar23._8_4_ <= auVar21._8_4_) &&
          auVar23._12_4_ <= auVar21._12_4_) {
        pCVar5[uVar16 + 1].code = 0;
      }
      auVar23 = (auVar22 | auVar2) ^ auVar4;
      iVar24 = auVar23._4_4_;
      if (iVar24 <= iVar9 && (iVar24 != iVar9 || auVar23._0_4_ <= auVar21._0_4_)) {
        pCVar5[uVar16 + 2].code = 0;
        pCVar5[uVar16 + 3].code = 0;
      }
      uVar16 = uVar16 + 4;
    } while (((uVar13 >> 3) + 4 & 0xfffffffffffffffc) != uVar16);
  }
  doSelection::maxTermHeads._nonemptyCells = 0;
  doSelection::maxTermHeads._size = 0;
  uVar13 = (ulong)eligible;
  Lib::DArray<Kernel::Literal_*>::ensure(&doSelection::litArr,uVar13);
  ppLVar12 = doSelection::litArr._array;
  if (eligible != 0) {
    lVar17 = uVar13 << 0x20;
    do {
      lVar17 = lVar17 + -0x100000000;
      ppLVar12[uVar13 - 1] = *(Literal **)((long)c->_literals + (lVar17 >> 0x1d));
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  local_80.super_LiteralComparator._selector = (this->_comp).super_LiteralComparator._selector;
  local_80._c1.super_LiteralComparator._selector =
       (this->_comp)._c1.super_LiteralComparator._selector;
  local_80._c2.super_LiteralComparator._selector =
       (this->_comp)._c2.super_LiteralComparator._selector;
  local_80._c2._c1.super_LiteralComparator._selector =
       (this->_comp)._c2._c1.super_LiteralComparator._selector;
  local_80._c2._c2.super_LiteralComparator._selector =
       (this->_comp)._c2._c2.super_LiteralComparator._selector;
  local_80.super_LiteralComparator._vptr_LiteralComparator = (_func_int **)&PTR__Composite_00b3c358;
  local_80._c1.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b3c398;
  local_80._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__Composite_00b3c3d8;
  local_80._c2._c1.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b3c418;
  local_80._c2._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b3c458;
  local_a0 = eligible;
  local_88 = this;
  Lib::DArray<Kernel::Literal*>::
  sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
            ((DArray<Kernel::Literal*> *)&doSelection::litArr,&local_80);
  local_a8 = (LiteralList *)0x0;
  if ((doSelection::combSup == true) &&
     (fillMaximals(local_88,&local_a8,&doSelection::litArr), local_a8 != (LiteralList *)0x0)) {
    pLVar14 = local_a8;
    do {
      pLVar14 = pLVar14->_tail;
      TVar10 = ApplicativeHelper::getHead((TermList)0x549503);
      TVar11 = ApplicativeHelper::getHead((TermList)0x54950e);
      if ((TVar10._content & 1) != 0) {
        uVar18 = (undefined4)(TVar10._content >> 2);
        local_80.super_LiteralComparator._vptr_LiteralComparator =
             (_func_int **)
             CONCAT44(local_80.super_LiteralComparator._vptr_LiteralComparator._4_4_,uVar18);
        uVar15 = 0x811c9dc5;
        lVar17 = 0;
        do {
          uVar15 = (*(byte *)((long)&local_80.super_LiteralComparator._vptr_LiteralComparator +
                             lVar17) ^ uVar15) * 0x1000193;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
        local_80.super_LiteralComparator._vptr_LiteralComparator =
             (_func_int **)
             CONCAT44(local_80.super_LiteralComparator._vptr_LiteralComparator._4_4_,uVar18);
        Lib::Set<unsigned_int,Lib::DefaultHash>::
        rawFindOrInsert<Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda()_1_,Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda(auto:1)_1_>
                  ((Set<unsigned_int,Lib::DefaultHash> *)&doSelection::maxTermHeads,
                   (anon_class_8_1_ba1d8281)&local_80,uVar15,(anon_class_8_1_ba1d8281)&local_80,
                   (bool *)&local_90);
      }
      if ((TVar11._content & 1) != 0) {
        uVar18 = (undefined4)(TVar11._content >> 2);
        local_80.super_LiteralComparator._vptr_LiteralComparator =
             (_func_int **)
             CONCAT44(local_80.super_LiteralComparator._vptr_LiteralComparator._4_4_,uVar18);
        uVar15 = 0x811c9dc5;
        lVar17 = 0;
        do {
          uVar15 = (*(byte *)((long)&local_80.super_LiteralComparator._vptr_LiteralComparator +
                             lVar17) ^ uVar15) * 0x1000193;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
        local_80.super_LiteralComparator._vptr_LiteralComparator =
             (_func_int **)
             CONCAT44(local_80.super_LiteralComparator._vptr_LiteralComparator._4_4_,uVar18);
        Lib::Set<unsigned_int,Lib::DefaultHash>::
        rawFindOrInsert<Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda()_1_,Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda(auto:1)_1_>
                  ((Set<unsigned_int,Lib::DefaultHash> *)&doSelection::maxTermHeads,
                   (anon_class_8_1_ba1d8281)&local_80,uVar15,(anon_class_8_1_ba1d8281)&local_80,
                   (bool *)&local_90);
      }
    } while (pLVar14 != (List<Kernel::Literal_*> *)0x0);
  }
  pCVar6 = local_88;
  this_00 = local_98;
  uVar15 = local_a0;
  pLVar19 = *doSelection::litArr._array;
  uVar13 = (pLVar19->super_Term)._args[0]._content;
  if ((pLVar19->super_Term)._functor == 0) {
    if ((uVar13 & 4) != 0) goto LAB_00549668;
  }
  else if ((local_88->super_LiteralSelector)._reversePolarity != (((uint)uVar13 >> 2 & 1) != 0)) {
LAB_00549668:
    if (doSelection::combSup == false) {
      fillMaximals(local_88,&local_a8,&doSelection::litArr);
      pLVar19 = *doSelection::litArr._array;
    }
    uVar13 = 1;
    pLVar20 = local_a8;
    while ((pLVar20->_head != pLVar19 || (pLVar20 = pLVar20->_tail, pLVar20 != (LiteralList *)0x0)))
    {
      pLVar19 = doSelection::litArr._array[uVar13];
      uVar16 = (pLVar19->super_Term)._args[0]._content;
      if ((pLVar19->super_Term)._functor == 0) {
        if ((uVar16 & 4) == 0) goto LAB_005495e6;
      }
      else if ((pCVar6->super_LiteralSelector)._reversePolarity == (((uint)uVar16 >> 2 & 1) != 0))
      goto LAB_005495e6;
      uVar13 = (ulong)((int)uVar13 + 1);
    }
    pLVar14 = local_a8;
    uVar8 = uVar15;
    if ((local_a8->_tail != (List<Kernel::Literal_*> *)0x0) ||
       (pLVar19 = local_a8->_head, pLVar19 == (Literal *)0x0)) goto LAB_005496e9;
  }
LAB_005495e6:
  uVar8 = Clause::getLiteralPosition(this_00,pLVar19);
  if (uVar8 != 0) {
    pLVar19 = this_00->_literals[0];
    this_00->_literals[0] = this_00->_literals[(int)uVar8];
    this_00->_literals[(int)uVar8] = pLVar19;
  }
  *(ulong *)&this_00->field_0x38 = *(ulong *)&this_00->field_0x38 & 0xfff00000ffffffff | 0x100000000
  ;
LAB_0054961d:
  Clause::notifyLiteralReorder(this_00);
  pLVar20 = local_a8;
joined_r0x0054962c:
  while (pLVar20 != (LiteralList *)0x0) {
    pLVar20->_head = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pLVar20;
    pLVar20 = pLVar20->_tail;
  }
  LiteralSelector::ensureSomeColoredSelected(this_00,uVar15);
  return;
LAB_005496e9:
  do {
    ppLVar1 = &pLVar14->_tail;
    uVar8 = uVar8 - 1;
    pLVar14 = *ppLVar1;
  } while (*ppLVar1 != (List<Kernel::Literal_*> *)0x0);
  if (uVar8 != 0) {
    if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
         ::doSelection(Kernel::Clause*,unsigned_int)::replaced == '\0') &&
       (iVar9 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                                     ::doSelection(Kernel::Clause*,unsigned_int)::replaced),
       iVar9 != 0)) {
      doSelection::replaced._capacity = 0x10;
      doSelection::replaced._stack = (Literal **)::operator_new(0x80,0x10);
      doSelection::replaced._end = doSelection::replaced._stack + doSelection::replaced._capacity;
      doSelection::replaced._cursor = doSelection::replaced._stack;
      __cxa_atexit(Lib::Stack<Kernel::Literal_*>::~Stack,&doSelection::replaced,&__dso_handle);
      __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                           ::doSelection(Kernel::Clause*,unsigned_int)::replaced);
      this_00 = local_98;
    }
    uVar15 = 0;
    local_80.super_LiteralComparator._vptr_LiteralComparator = (_func_int **)0x0;
    local_80.super_LiteralComparator._selector =
         (LiteralSelector *)((ulong)local_80.super_LiteralComparator._selector & 0xffffffff00000000)
    ;
    local_80._c1.super_LiteralComparator._vptr_LiteralComparator = (_func_int **)0x0;
    Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::expand
              ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)&local_80);
    if (local_a8 != (LiteralList *)0x0) {
      pLVar14 = local_a8;
      do {
        local_90 = pLVar14->_head;
        uVar15 = 0x811c9dc5;
        lVar17 = 0;
        do {
          uVar15 = (*(byte *)((long)&local_90 + lVar17) ^ uVar15) * 0x1000193;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 8);
        Lib::Set<Kernel::Literal*,Lib::DefaultHash>::
        rawFindOrInsert<Lib::Set<Kernel::Literal*,Lib::DefaultHash>::insert(Kernel::Literal*,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Literal*,Lib::DefaultHash>::insert(Kernel::Literal*,unsigned_int)::_lambda(auto:1)_1_>
                  ((Set<Kernel::Literal*,Lib::DefaultHash> *)&local_80,
                   (anon_class_8_1_ba1d8281)&local_90,uVar15,(anon_class_8_1_ba1d8281)&local_90,
                   &local_99);
        pLVar14 = pLVar14->_tail;
      } while (pLVar14 != (List<Kernel::Literal_*> *)0x0);
      if (local_a8 == (LiteralList *)0x0) {
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        do {
          bVar7 = Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::contains
                            ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)&local_80,
                             this_00->_literals[(int)uVar15]);
          if (!bVar7) {
            pLVar19 = this_00->_literals[(int)uVar15];
            if (doSelection::replaced._cursor == doSelection::replaced._end) {
              Lib::Stack<Kernel::Literal_*>::expand(&doSelection::replaced);
            }
            *doSelection::replaced._cursor = pLVar19;
            doSelection::replaced._cursor = doSelection::replaced._cursor + 1;
            this_00 = local_98;
          }
          pLVar19 = local_a8->_head;
          pLVar14 = local_a8->_tail;
          local_a8->_head = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_a8;
          this_00->_literals[(int)uVar15] = pLVar19;
          uVar15 = uVar15 + 1;
          local_a8 = pLVar14;
        } while (pLVar14 != (List<Kernel::Literal_*> *)0x0);
      }
    }
    if (doSelection::replaced._cursor != doSelection::replaced._stack) {
      uVar8 = uVar15;
      do {
        bVar7 = Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::contains
                          ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)&local_80,
                           this_00->_literals[(int)uVar8]);
        if (bVar7) {
          ppLVar12 = doSelection::replaced._cursor + -1;
          doSelection::replaced._cursor = doSelection::replaced._cursor + -1;
          this_00->_literals[(int)uVar8] = *ppLVar12;
          if (doSelection::replaced._cursor == doSelection::replaced._stack) break;
        }
        uVar8 = uVar8 + 1;
      } while( true );
    }
    *(ulong *)&this_00->field_0x38 =
         *(ulong *)&this_00->field_0x38 & 0xfff00000ffffffff | (ulong)(uVar15 & 0xfffff) << 0x20;
    Clause::notifyLiteralReorder(this_00);
    uVar15 = local_a0;
    pLVar20 = local_a8;
    if ((LiteralList *)local_80._c1.super_LiteralComparator._vptr_LiteralComparator !=
        (LiteralList *)0x0) {
      if ((long)(int)local_80.super_LiteralComparator._vptr_LiteralComparator == 0) {
        *local_80._c1.super_LiteralComparator._vptr_LiteralComparator =
             (_func_int *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ =
             local_80._c1.super_LiteralComparator._vptr_LiteralComparator;
      }
      else {
        uVar13 = (long)(int)local_80.super_LiteralComparator._vptr_LiteralComparator * 0x10;
        if (uVar13 < 0x11) {
          *local_80._c1.super_LiteralComparator._vptr_LiteralComparator =
               (_func_int *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ =
               local_80._c1.super_LiteralComparator._vptr_LiteralComparator;
        }
        else if (uVar13 < 0x19) {
          *local_80._c1.super_LiteralComparator._vptr_LiteralComparator =
               (_func_int *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ =
               local_80._c1.super_LiteralComparator._vptr_LiteralComparator;
        }
        else if (uVar13 < 0x21) {
          *local_80._c1.super_LiteralComparator._vptr_LiteralComparator =
               (_func_int *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ =
               local_80._c1.super_LiteralComparator._vptr_LiteralComparator;
        }
        else if (uVar13 < 0x31) {
          *local_80._c1.super_LiteralComparator._vptr_LiteralComparator =
               (_func_int *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ =
               local_80._c1.super_LiteralComparator._vptr_LiteralComparator;
        }
        else if (uVar13 < 0x41) {
          *local_80._c1.super_LiteralComparator._vptr_LiteralComparator =
               (_func_int *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ =
               local_80._c1.super_LiteralComparator._vptr_LiteralComparator;
        }
        else {
          operator_delete(local_80._c1.super_LiteralComparator._vptr_LiteralComparator,0x10);
          pLVar20 = local_a8;
        }
      }
    }
    goto joined_r0x0054962c;
  }
  *(ulong *)&this_00->field_0x38 =
       *(ulong *)&this_00->field_0x38 & 0xfff00000ffffffff | (ulong)(uVar15 & 0xfffff) << 0x20;
  goto LAB_0054961d;
}

Assistant:

void doSelection(Clause* c, unsigned eligible) override
  {
    ASS_G(eligible, 1); //trivial cases should be taken care of by the base LiteralSelector

    static bool combSup = env.options->combinatorySup();

    static DArray<Literal*> litArr(64);
    static Set<unsigned> maxTermHeads;
    maxTermHeads.reset();
    litArr.initFromArray(eligible,*c);
    litArr.sortInversed(_comp);

    LiteralList* maximals=0;
    Literal* singleSelected=0; //If equals to 0 in the end, all maximal

    if(combSup){ 
      fillMaximals(maximals, litArr); 
      LiteralList::Iterator maxIt(maximals);
      while(maxIt.hasNext()){
        Literal* lit = maxIt.next();
        TermList t0 = *lit->nthArgument(0);
        TermList t1 = *lit->nthArgument(1);
        TermList h0 = ApplicativeHelper::getHead(t0);  
        TermList h1 = ApplicativeHelper::getHead(t1);
        if(h0.isVar()){ maxTermHeads.insert(h0.var()); }
        if(h1.isVar()){ maxTermHeads.insert(h1.var()); }
      }
    }
    //literals will be selected.
    bool allSelected=false;

    if(isNegativeForSelection(litArr[0])) {
      singleSelected=litArr[0];
    } else {
      if(!combSup){ fillMaximals(maximals, litArr); }
      unsigned besti=0;
      LiteralList* nextMax=maximals;
      while(true) {
        if(nextMax->head()==litArr[besti]) {
          nextMax=nextMax->tail();
          if(nextMax==0) {
            break;
          }
        }
        besti++;
        ASS_L(besti,eligible);
        if(isNegativeForSelection(litArr[besti])){
          singleSelected=litArr[besti];
          break;
        }
      }
    }
    if(!singleSelected && !maximals->tail()) {
      //there is only one maximal literal
      singleSelected=maximals->head();
    }
    if(!singleSelected) {
      unsigned selCnt=0;
      for(LiteralList* mit=maximals; mit; mit=mit->tail()) {
        ASS(isPositiveForSelection(mit->head()));
        selCnt++;
      }
      if(selCnt==eligible) {
        allSelected=true;
      }
    }
    if(allSelected) {
      c->setSelected(eligible);
    } else if(!singleSelected) {
      //select multiple maximal literals
      static Stack<Literal*> replaced(16);
      Set<Literal*> maxSet;
      unsigned selCnt=0;

      for(LiteralList* mit=maximals; mit; mit=mit->tail()) {
        maxSet.insert(mit->head());
      }

      while(maximals) {
        if(!maxSet.contains((*c)[selCnt])) {
          replaced.push((*c)[selCnt]);
        }
        (*c)[selCnt]=LiteralList::pop(maximals);
        selCnt++;
      }
      ASS_G(selCnt,1);
      ASS_LE(selCnt,eligible);

      //put back non-selected literals that were removed
      unsigned i=selCnt;
      while(replaced.isNonEmpty()) {
        while(!maxSet.contains((*c)[i])) {
          i++;
          ASS_L(i,eligible);
        }
        (*c)[i++]=replaced.pop();
      }

      c->setSelected(selCnt);
    } else {
      unsigned besti=c->getLiteralPosition(singleSelected);
      if(besti!=0) {
        std::swap((*c)[0],(*c)[besti]);
      }
      c->setSelected(1);
    }
    LiteralList::destroy(maximals);

    ensureSomeColoredSelected(c, eligible);
  }